

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

FuncVec * __thiscall
dg::llvmdg::LLVMPTACallGraphImpl::callees
          (FuncVec *__return_storage_ptr__,LLVMPTACallGraphImpl *this,Function *F)

{
  pointer *pppFVar1;
  iterator __position;
  _Base_ptr p_Var2;
  _Base_ptr *pp_Var3;
  _Base_ptr p_Var4;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (*(Function **)(p_Var2 + 1) >= F) {
      p_Var4 = p_Var2;
    }
    p_Var2 = (&p_Var2->_M_left)[*(Function **)(p_Var2 + 1) < F];
  } while (p_Var2 != (_Base_ptr)0x0);
  pp_Var3 = (_Base_ptr *)0x0;
  if (*(Function **)(p_Var4 + 1) <= F) {
    pp_Var3 = &p_Var4[1]._M_parent;
  }
  p_Var4 = pp_Var3[2];
  for (p_Var2 = pp_Var3[1]; p_Var2 != p_Var4; p_Var2 = (_Base_ptr)&p_Var2->_M_parent) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_realloc_insert<llvm::Function_const*const&>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 __return_storage_ptr__,__position,(Function **)(*(long *)p_Var2 + 0x38));
    }
    else {
      *__position._M_current = *(Function **)(*(long *)p_Var2 + 0x38);
      pppFVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        const auto *fnd = _cg.get(F);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }